

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::loops_leave(Forth *this)

{
  uint uVar1;
  
  data(this,8);
  data(this,8);
  data(this,5);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->controlStackLoops);
  data(this,(uVar1 - this->dataPointer) + 8);
  data(this,9);
  return;
}

Assistant:

void loops_leave(){
			data(rFrom_Xt);
			data(rFrom_Xt);
			data(branchXt);
			auto cell = controlStackLoops.getTop(); 
			data(cell - getDataPointer()+8);
			data(DropDropXt);
		}